

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

OpenJTalk * openjtalk_initializeU16(char16_t *voice,char16_t *dic,char16_t *voiceDir)

{
  OpenJTalk *pOVar1;
  char voiceDir_temp [260];
  char dic_temp [260];
  char voice_temp [260];
  char local_338 [272];
  char local_228 [272];
  char local_118 [264];
  
  local_118[0] = '\0';
  if (voice != (char16_t *)0x0) {
    convert_charset_path((char *)voice,CS_UTF_16LE,local_118,CS_UTF_8);
  }
  local_228[0] = '\0';
  if (dic != (char16_t *)0x0) {
    convert_charset_path((char *)dic,CS_UTF_16LE,local_228,CS_UTF_8);
  }
  local_338[0] = '\0';
  if (voiceDir != (char16_t *)0x0) {
    convert_charset_path((char *)voiceDir,CS_UTF_16LE,local_338,CS_UTF_8);
  }
  pOVar1 = openjtalk_initialize_sub(local_118,local_228,local_338);
  return pOVar1;
}

Assistant:

OPENJTALK_DLL_API OpenJTalk *OPENJTALK_CONVENTION openjtalk_initializeU16(const char16_t *voice, const char16_t *dic, const char16_t *voiceDir)
{
	char voice_temp[MAX_PATH];
	char dic_temp[MAX_PATH];
	char voiceDir_temp[MAX_PATH];

	voice_temp[0] = '\0';
	if (voice != NULL)
	{
#if defined(_WIN32)
		u16tou8_path(voice, voice_temp);
#else
		u16tou8_path(voice, voice_temp);
#endif
	}

	dic_temp[0] = '\0';
	if (dic != NULL)
	{
#if defined(_WIN32)
		u16tou8_path(dic, dic_temp);
#else
		u16tou8_path(dic, dic_temp);
#endif
	}

	voiceDir_temp[0] = '\0';
	if (voiceDir != NULL)
	{
#if defined(_WIN32)
		u16tou8_path(voiceDir, voiceDir_temp);
#else
		u16tou8_path(voiceDir, voiceDir_temp);
#endif
	}

	return openjtalk_initialize_sub(voice_temp, dic_temp, voiceDir_temp);
}